

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
NoiseCoeffsSignalsDifferentNoiseType<BitDepthParams<unsigned_short,_10,_true>_>::TestBody
          (NoiseCoeffsSignalsDifferentNoiseType<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  aom_noise_model_t *noise_model;
  uint8_t **data;
  uint8_t **denoised;
  double *pdVar1;
  data_type_t_conflict *pdVar2;
  double *pdVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined6 uVar8;
  int iVar9;
  int iVar10;
  undefined8 *puVar11;
  byte bVar12;
  long lVar13;
  SEARCH_METHODS *pSVar14;
  char cVar15;
  AssertHelper local_70;
  Message local_68;
  EqHelper local_60 [8];
  undefined8 *local_58;
  int *local_50;
  int *local_48;
  ACMRandom *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_40 = &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).random_;
  anon_unknown.dwarf_9b569f::noise_synth
            (local_40,(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                      model_.params.lag,
             (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.n,
             (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.
             coords,(double *)&DAT_00c25890,
             (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
             noise_ptr_[0],0x80,0x80);
  pdVar2 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).data_ptr_
           [0];
  pdVar3 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).noise_ptr_
           [0];
  lVar13 = 0;
  do {
    pdVar1 = pdVar3 + lVar13;
    iVar9 = (int)(*pdVar1 + 128.0);
    iVar10 = (int)(pdVar1[1] + 128.0);
    cVar15 = (char)((uint)iVar10 >> 0x10);
    uVar8 = CONCAT15((char)((uint)iVar10 >> 8),CONCAT14((char)iVar10,iVar9));
    sVar4 = (short)iVar9;
    sVar5 = (short)((uint)iVar9 >> 0x10);
    sVar6 = (short)((uint6)uVar8 >> 0x20);
    sVar7 = (short)(CONCAT17((char)((uint)iVar10 >> 0x18),CONCAT16(cVar15,uVar8)) >> 0x30);
    *(uint *)(pdVar2 + lVar13) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar15 - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * (char)iVar10 - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar9 >> 0x10) -
                                    (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * (char)iVar9 - (0xff < sVar4))));
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0x4000);
  local_38 = &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
              flat_blocks_;
  local_60[0] = (EqHelper)0x1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (local_38,(long)(this->
                            super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                            flat_blocks_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->
                            super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                            flat_blocks_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
             (value_type_conflict3 *)local_60);
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  noise_model = &(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                 model_;
  data = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).data_ptr_raw_
  ;
  denoised = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
             denoised_ptr_raw_;
  local_50 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).strides_;
  local_48 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
             chroma_sub_;
  bVar12 = aom_noise_model_update
                     (noise_model,data,denoised,0x80,0x80,local_50,local_48,
                      (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                      flat_blocks_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start,0x10);
  local_70.data_._0_4_ = (uint)bVar12;
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            (local_60,"AOM_NOISE_STATUS_OK","this->NoiseModelUpdate()",(anon_enum_32 *)&local_68,
             (int *)&local_70);
  if (local_60[0] == (EqHelper)0x0) {
    testing::Message::Message(&local_68);
    if (local_58 == (undefined8 *)0x0) {
      pSVar14 = "";
    }
    else {
      pSVar14 = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x3ba,(char *)pSVar14);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)CONCAT44(local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar11 = local_58;
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(puVar11);
  }
  anon_unknown.dwarf_9b569f::noise_synth
            (local_40,(this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
                      model_.params.lag,
             (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.n,
             (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).model_.
             coords,(double *)&DAT_00c25950,
             (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).
             noise_ptr_[0],0x80,0x80);
  pdVar2 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).data_ptr_
           [0];
  pdVar3 = (this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>).noise_ptr_
           [0];
  lVar13 = 0;
  do {
    pdVar1 = pdVar3 + lVar13;
    iVar9 = (int)(*pdVar1 + 128.0);
    iVar10 = (int)(pdVar1[1] + 128.0);
    cVar15 = (char)((uint)iVar10 >> 0x10);
    uVar8 = CONCAT15((char)((uint)iVar10 >> 8),CONCAT14((char)iVar10,iVar9));
    sVar4 = (short)iVar9;
    sVar5 = (short)((uint)iVar9 >> 0x10);
    sVar6 = (short)((uint6)uVar8 >> 0x20);
    sVar7 = (short)(CONCAT17((char)((uint)iVar10 >> 0x18),CONCAT16(cVar15,uVar8)) >> 0x30);
    *(uint *)(pdVar2 + lVar13) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar15 - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * (char)iVar10 - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar9 >> 0x10) -
                                    (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * (char)iVar9 - (0xff < sVar4))));
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0x4000);
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  bVar12 = aom_noise_model_update
                     (noise_model,data,denoised,0x80,0x80,local_50,local_48,
                      (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start,0x10);
  local_70.data_._0_4_ = (uint)bVar12;
  testing::internal::EqHelper::
  Compare<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_1510_m_ab_s[P]aom_aom_dsp_noise_model_h:206:1),_int,_nullptr>
            (local_60,"AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE","this->NoiseModelUpdate()",
             (anon_enum_32 *)&local_68,(int *)&local_70);
  if (local_60[0] == (EqHelper)0x0) {
    testing::Message::Message(&local_68);
    if (local_58 == (undefined8 *)0x0) {
      pSVar14 = "";
    }
    else {
      pSVar14 = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x3c2,(char *)pSVar14);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)CONCAT44(local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_68.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_68.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(local_58);
  }
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, NoiseCoeffsSignalsDifferentNoiseType) {
  aom_noise_model_t &model = this->model_;
  const int width = this->kWidth;
  const int height = this->kHeight;
  const double kCoeffs[2][24] = {
    { 0.02884, -0.03356, 0.00633,  0.01757,  0.02849,  -0.04620,
      0.02833, -0.07178, 0.07076,  -0.11603, -0.10413, -0.16571,
      0.05158, -0.07969, 0.02640,  -0.07191, 0.02530,  0.41968,
      0.21450, -0.00702, -0.01401, -0.03676, -0.08713, 0.44196 },
    { 0.00269, -0.01291, -0.01513, 0.07234,  0.03208,   0.00477,
      0.00226, -0.00254, 0.03533,  0.12841,  -0.25970,  -0.06336,
      0.05238, -0.00845, -0.03118, 0.09043,  -0.36558,  0.48903,
      0.00595, -0.11938, 0.02106,  0.095956, -0.350139, 0.59305 }
  };

  noise_synth(&this->random_, model.params.lag, model.n, model.coords,
              kCoeffs[0], this->noise_ptr_[0], width, height);
  for (int i = 0; i < width * height; ++i) {
    this->data_ptr_[0][i] = (uint8_t)(128 + this->noise_ptr_[0][i]);
  }
  this->flat_blocks_.assign(this->flat_blocks_.size(), 1);
  EXPECT_EQ(AOM_NOISE_STATUS_OK, this->NoiseModelUpdate());

  // Now try with the second set of AR coefficients
  noise_synth(&this->random_, model.params.lag, model.n, model.coords,
              kCoeffs[1], this->noise_ptr_[0], width, height);
  for (int i = 0; i < width * height; ++i) {
    this->data_ptr_[0][i] = (uint8_t)(128 + this->noise_ptr_[0][i]);
  }
  EXPECT_EQ(AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE, this->NoiseModelUpdate());
}